

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O1

bool __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::get(SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      *this,unsigned_long i)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  __hash_code __code;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  bool bVar7;
  
  p_Var3 = (_Hash_node_base *)(i & 0xffffffffffffffc0);
  uVar1 = (this->_bits).
          super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
          .
          super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ._M_h._M_bucket_count;
  uVar4 = (ulong)p_Var3 % uVar1;
  p_Var5 = (this->_bits).
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, p_Var3 != p_Var5->_M_nxt[1]._M_nxt)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var3 == p_Var2[1]._M_nxt)) goto LAB_0011a2c3;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0011a2c3:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = ((ulong)p_Var3[2]._M_nxt >> (i & 0x3f) & 1) != 0;
  }
  return bVar7;
}

Assistant:

static ShiftT _shift(IndexT i) { return i - (i % BITS_IN_BUCKET); }